

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O2

RealType RosenD(int m,int n,int p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  RealType *pRVar5;
  double *pdVar6;
  RealType RVar7;
  double dVar8;
  
  uVar1 = n + m + p;
  if ((int)uVar1 < 0x98) {
    uVar1 = 0;
    if (0 < p - m) {
      uVar1 = p - m;
    }
    uVar2 = (ulong)uVar1;
    iVar3 = n;
    if (p < n) {
      iVar3 = p;
    }
    pdVar4 = fact + uVar2;
    pRVar5 = fact + -uVar2;
    pdVar6 = fact + (long)(m - p) + uVar2;
    RVar7 = 0.0;
    for (; (long)uVar2 <= (long)iVar3; uVar2 = uVar2 + 1) {
      dVar8 = fact[m] / (pRVar5[p] * *pdVar6);
      if ((uVar2 & 1) == 0) {
        RVar7 = RVar7 + dVar8 * (fact[n] / (pRVar5[n] * *pdVar4));
      }
      else {
        RVar7 = RVar7 - dVar8 * (fact[n] / (pRVar5[n] * *pdVar4));
      }
      pdVar4 = pdVar4 + 1;
      pRVar5 = pRVar5 + -1;
      pdVar6 = pdVar6 + 1;
    }
    return RVar7;
  }
  printf("Error, arguments exceed maximum factorial computed %d > %d\n",(ulong)uVar1,0x97);
  exit(0);
}

Assistant:

inline RealType RosenD(int m, int n, int p) {
  if (m + n + p > maxFact) {
    printf("Error, arguments exceed maximum factorial computed %d > %d\n",
           m + n + p, maxFact);
    ::exit(0);
  }

  RealType RosenD_ = 0;
  for (int k = max(p - m, 0); k <= min(n, p); k++) {
    if (mod(k, 2) == 0)
      RosenD_ += (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
    else
      RosenD_ -= (fact[m] / (fact[p - k] * fact[m - p + k])) *
                 (fact[n] / (fact[n - k] * fact[k]));
  }
  return RosenD_;
}